

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_property.cpp
# Opt level: O2

string * __thiscall
lsim::IntegerProperty::value_as_string_abi_cxx11_
          (string *__return_storage_ptr__,IntegerProperty *this)

{
  std::__cxx11::to_string(__return_storage_ptr__,this->m_value);
  return __return_storage_ptr__;
}

Assistant:

std::string IntegerProperty::value_as_string() const {
    return std::to_string(m_value);
}